

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

TypedAttribute<int> * Imf_3_4::TypedAttribute<int>::cast(Attribute *attribute)

{
  TypeExc *this;
  long in_RDI;
  TypedAttribute<int> *t;
  TypedAttribute<int> *local_30;
  
  if (in_RDI == 0) {
    local_30 = (TypedAttribute<int> *)0x0;
  }
  else {
    local_30 = (TypedAttribute<int> *)__dynamic_cast(in_RDI,&Attribute::typeinfo,&typeinfo,0);
  }
  if (local_30 == (TypedAttribute<int> *)0x0) {
    this = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::TypeExc::TypeExc(this,"Unexpected attribute type.");
    __cxa_throw(this,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
  }
  return local_30;
}

Assistant:

const TypedAttribute<T>*
TypedAttribute<T>::cast (const Attribute* attribute)
{
    const TypedAttribute<T>* t =
        dynamic_cast<const TypedAttribute<T>*> (attribute);

    if (t == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}